

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O1

s32 __thiscall irr::gui::CGUISpriteBank::addTextureAsSprite(CGUISpriteBank *this,ITexture *texture)

{
  pointer *pprVar1;
  iterator __position;
  pointer prVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  s32 sVar6;
  SGUISpriteFrame frame;
  value_type local_58;
  SGUISpriteFrame local_30;
  
  if (texture == (ITexture *)0x0) {
    sVar6 = -1;
  }
  else {
    (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[4])();
    iVar5 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])(this);
    local_30.textureNumber = iVar5 - 1;
    __position._M_current =
         (this->Rectangles).m_data.
         super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    prVar2 = (this->Rectangles).m_data.
             super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_finish = *(pointer *)&texture->OriginalSize;
    if (__position._M_current ==
        (this->Rectangles).m_data.
        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<irr::core::rect<int>,std::allocator<irr::core::rect<int>>>::
      _M_realloc_insert<irr::core::rect<int>>
                ((vector<irr::core::rect<int>,std::allocator<irr::core::rect<int>>> *)
                 &this->Rectangles,__position,(rect<int> *)&local_58);
    }
    else {
      ((__position._M_current)->UpperLeftCorner).X = 0;
      ((__position._M_current)->UpperLeftCorner).Y = 0;
      ((__position._M_current)->LowerRightCorner).X =
           (uint)local_58.Frames.m_data.
                 super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ((__position._M_current)->LowerRightCorner).Y =
           SUB84(local_58.Frames.m_data.
                 super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish,4);
      pprVar1 = &(this->Rectangles).m_data.
                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
    (this->Rectangles).is_sorted = false;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.Frames.is_sorted = true;
    local_58.frameTime = 0;
    local_30.rectNumber = (u32)((ulong)((long)__position._M_current - (long)prVar2) >> 4);
    core::array<irr::gui::SGUISpriteFrame>::push_back(&local_58.Frames,&local_30);
    ::std::vector<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_>::push_back
              ((vector<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_> *)
               &(this->super_IGUISpriteBank).field_0x8,&local_58);
    this->field_0x20 = 0;
    lVar3 = *(long *)&(this->super_IGUISpriteBank).field_0x10;
    lVar4 = *(long *)&(this->super_IGUISpriteBank).field_0x8;
    if (local_58.Frames.m_data.
        super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.Frames.m_data.
                      super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.Frames.m_data.
                            super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.Frames.m_data.
                            super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    sVar6 = (int)((ulong)(lVar3 - lVar4) >> 3) * -0x33333333 + -1;
  }
  return sVar6;
}

Assistant:

s32 CGUISpriteBank::addTextureAsSprite(video::ITexture *texture)
{
	if (!texture)
		return -1;

	addTexture(texture);
	u32 textureIndex = getTextureCount() - 1;

	u32 rectangleIndex = Rectangles.size();
	Rectangles.push_back(core::rect<s32>(0, 0, texture->getOriginalSize().Width, texture->getOriginalSize().Height));

	SGUISprite sprite;
	sprite.frameTime = 0;

	SGUISpriteFrame frame;
	frame.textureNumber = textureIndex;
	frame.rectNumber = rectangleIndex;
	sprite.Frames.push_back(frame);

	Sprites.push_back(sprite);

	return Sprites.size() - 1;
}